

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::getAdaptationMatrix
               (float *m,int type,float wx0,float wy0,float wz0,float wx1,float wy1,float wz1)

{
  int in_ESI;
  float *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float bet2;
  float gam2;
  float rho2;
  float bet1;
  float gam1;
  float rho1;
  float bet0;
  float gam0;
  float rho0;
  float *inv;
  float *cat;
  int i;
  float *local_68;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  int local_28;
  
  if (in_ESI == 0) {
    for (local_28 = 0; local_28 < 9; local_28 = local_28 + 1) {
      in_RDI[local_28] = 0.0;
    }
    *in_RDI = in_XMM3_Da / in_XMM0_Da;
    in_RDI[4] = in_XMM4_Da / in_XMM1_Da;
    in_RDI[8] = in_XMM5_Da / in_XMM2_Da;
  }
  else {
    if (in_ESI == 1) {
      local_68 = getAdaptationMatrix::bradford;
    }
    else {
      local_68 = getAdaptationMatrix::vonkries;
    }
    mulMatrix((float *)&stack0xffffffffffffffc4,(float *)&stack0xffffffffffffffc0,
              (float *)&stack0xffffffffffffffbc,local_68,(double)in_XMM0_Da,(double)in_XMM1_Da,
              (double)in_XMM2_Da);
    mulMatrix((float *)&stack0xffffffffffffffb8,(float *)&stack0xffffffffffffffb4,
              (float *)&stack0xffffffffffffffb0,local_68,(double)in_XMM3_Da,(double)in_XMM4_Da,
              (double)in_XMM5_Da);
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      in_RDI[local_28] =
           (in_stack_ffffffffffffffb8 / in_stack_ffffffffffffffc4) * local_68[local_28];
      in_RDI[local_28 + 3] =
           (in_stack_ffffffffffffffb4 / in_stack_ffffffffffffffc0) * local_68[local_28 + 3];
      in_RDI[local_28 + 6] =
           (in_stack_ffffffffffffffb0 / in_stack_ffffffffffffffbc) * local_68[local_28 + 6];
    }
    mulMatrixMatrix((float *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (float *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  return 0;
}

Assistant:

static unsigned getAdaptationMatrix(float* m, int type,
                                    float wx0, float wy0, float wz0,
                                    float wx1, float wy1, float wz1) {
  int i;
  static const float bradford[9] = {
    0.8951, 0.2664, -0.1614,
    -0.7502, 1.7135, 0.0367,
    0.0389, -0.0685, 1.0296
  };
  static const float bradfordinv[9] = {
    0.9869929, -0.1470543, 0.1599627,
    0.4323053, 0.5183603, 0.0492912,
   -0.0085287, 0.0400428, 0.9684867
  };
  static const float vonkries[9] = {
    0.40024, 0.70760, -0.08081,
    -0.22630, 1.16532, 0.04570,
    0.00000, 0.00000, 0.91822,
  };
  static const float vonkriesinv[9] = {
    1.8599364, -1.1293816, 0.2198974,
    0.3611914, 0.6388125, -0.0000064,
   0.0000000, 0.0000000, 1.0890636
  };
  if(type == 0) {
    for(i = 0; i < 9; i++) m[i] = 0;
    m[0] = wx1 / wx0;
    m[4] = wy1 / wy0;
    m[8] = wz1 / wz0;
  } else {
    const float* cat = (type == 1) ? bradford : vonkries;
    const float* inv = (type == 1) ? bradfordinv : vonkriesinv;
    float rho0, gam0, bet0, rho1, gam1, bet1, rho2, gam2, bet2;
    mulMatrix(&rho0, &gam0, &bet0, cat, wx0, wy0, wz0);
    mulMatrix(&rho1, &gam1, &bet1, cat, wx1, wy1, wz1);
    rho2 = rho1 / rho0;
    gam2 = gam1 / gam0;
    bet2 = bet1 / bet0;
    /* Multiply diagonal matrix with cat */
    for(i = 0; i < 3; i++) {
      m[i + 0] = rho2 * cat[i + 0];
      m[i + 3] = gam2 * cat[i + 3];
      m[i + 6] = bet2 * cat[i + 6];
    }
    mulMatrixMatrix(m, inv, m);
  }
  return 0; /* ok */
}